

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void vdbeSorterExtendFile(sqlite3 *db,sqlite3_file *pFd,i64 nByte)

{
  long in_FS_OFFSET;
  int chunksize;
  void *p;
  undefined4 local_34;
  void *local_30;
  i64 local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = nByte;
  if ((nByte <= (int)db) && (2 < pFd->pMethods->iVersion)) {
    local_30 = (void *)0x0;
    local_34 = 0x1000;
    (*pFd->pMethods->xFileControl)(pFd,6,&local_34);
    (*pFd->pMethods->xFileControl)(pFd,5,&local_28);
    (*pFd->pMethods->xFetch)(pFd,0,(int)local_28,&local_30);
    if (local_30 != (void *)0x0) {
      (*pFd->pMethods->xUnfetch)(pFd,0,local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void vdbeSorterExtendFile(sqlite3 *db, sqlite3_file *pFd, i64 nByte){
  if( nByte<=(i64)(db->nMaxSorterMmap) && pFd->pMethods->iVersion>=3 ){
    void *p = 0;
    int chunksize = 4*1024;
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_CHUNK_SIZE, &chunksize);
    sqlite3OsFileControlHint(pFd, SQLITE_FCNTL_SIZE_HINT, &nByte);
    sqlite3OsFetch(pFd, 0, (int)nByte, &p);
    if( p ) sqlite3OsUnfetch(pFd, 0, p);
  }
}